

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_writeValueInfo
                 (qpTestLog *log,char *name,char *description,char *unit,qpSampleValueTag tag)

{
  char *pcVar1;
  int numAttribs;
  deBool dVar2;
  qpXmlAttribute attribs [4];
  
  pcVar1 = s_qpSampleValueTagMap[(int)tag].string;
  deMutex_lock(log->lock);
  attribs[0].name = "Name";
  attribs[0].type = QP_XML_ATTRIBUTE_STRING;
  attribs[0].intValue = -0x2a6;
  attribs[0].boolValue = -1;
  attribs[1].name = "Description";
  attribs[1].type = QP_XML_ATTRIBUTE_STRING;
  attribs[1].intValue = -0x2a6;
  attribs[1].boolValue = -1;
  attribs[2].name = "Tag";
  attribs[2].type = QP_XML_ATTRIBUTE_STRING;
  attribs[2].intValue = -0x2a6;
  attribs[2].boolValue = -1;
  if (unit == (char *)0x0) {
    numAttribs = 3;
  }
  else {
    attribs[3].name = "Unit";
    attribs[3].type = QP_XML_ATTRIBUTE_STRING;
    attribs[3].intValue = -0x2a6;
    attribs[3].boolValue = -1;
    numAttribs = 4;
    attribs[3].stringValue = unit;
  }
  attribs[0].stringValue = name;
  attribs[1].stringValue = description;
  attribs[2].stringValue = pcVar1;
  dVar2 = qpXmlWriter_startElement(log->writer,"ValueInfo",numAttribs,attribs);
  if (dVar2 != 0) {
    dVar2 = qpXmlWriter_endElement(log->writer,"ValueInfo");
    if (dVar2 != 0) {
      dVar2 = 1;
      goto LAB_0163a961;
    }
  }
  dVar2 = 0;
  qpPrintf("qpTestLog_writeValueInfo(): Writing XML failed\n");
LAB_0163a961:
  deMutex_unlock(log->lock);
  return dVar2;
}

Assistant:

deBool qpTestLog_writeValueInfo (qpTestLog* log, const char* name, const char* description, const char* unit, qpSampleValueTag tag)
{
	const char*		tagName		= QP_LOOKUP_STRING(s_qpSampleValueTagMap, tag);
	int				numAttribs	= 0;
	qpXmlAttribute	attribs[4];

	DE_ASSERT(log && name && description && tagName);
	deMutex_lock(log->lock);

	DE_ASSERT(ContainerStack_getTop(&log->containerStack) == CONTAINERTYPE_SAMPLEINFO);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Description", description);
	attribs[numAttribs++] = qpSetStringAttrib("Tag", tagName);

	if (unit)
		attribs[numAttribs++] = qpSetStringAttrib("Unit", unit);

	if (!qpXmlWriter_startElement(log->writer, "ValueInfo", numAttribs, attribs) ||
		!qpXmlWriter_endElement(log->writer, "ValueInfo"))
	{
		qpPrintf("qpTestLog_writeValueInfo(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}